

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_602a57::HandleArchiveExtractCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  cmArgumentParser<Arguments> *pcVar4;
  cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *pcVar5;
  reference b;
  cmMakefile *pcVar6;
  string *psVar7;
  ulong uVar8;
  static_string_view sVar9;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar10;
  string local_360;
  string local_340;
  undefined1 local_320 [8];
  cmWorkingDirectory workdir;
  string local_2d8;
  string local_2b8;
  Status local_298;
  string local_290;
  undefined1 local_270 [8];
  string destDir;
  undefined1 local_230 [8];
  string inFile;
  string local_208;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  iterator argIt;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1c8;
  undefined1 local_1b8 [8];
  Arguments parsedArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  cmArgumentParser<Arguments> local_98;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  if (((anonymous_namespace)::
       HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar3 != 0)) {
    local_98.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
    local_98.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
    local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
    local_98.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
    local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
         (void *)0x0;
    local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
    local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
         (_Manager_type)0x0;
    local_98.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
    _M_object = (void *)0x0;
    local_98.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_98);
    sVar9 = ::cm::operator____s("INPUT",5);
    pcVar4 = cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::Bind<std::__cxx11::string>
                       ((cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                         *)&local_98,sVar9,0x30);
    sVar9 = ::cm::operator____s("VERBOSE",7);
    pcVar4 = cmArgumentParser<Arguments>::Bind<bool>(pcVar4,sVar9,0x50);
    sVar9 = ::cm::operator____s("LIST_ONLY",9);
    pcVar5 = (cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<Arguments>::Bind<bool>(pcVar4,sVar9,0x51);
    sVar9 = ::cm::operator____s("DESTINATION",0xb);
    pcVar5 = (cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar5,sVar9,0x58);
    sVar9 = ::cm::operator____s("PATTERNS",8);
    pcVar4 = cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::
             Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (pcVar5,sVar9,0x78);
    sVar9 = ::cm::operator____s("TOUCH",5);
    pcVar4 = cmArgumentParser<Arguments>::Bind<bool>(pcVar4,sVar9,0x90);
    cmArgumentParser<Arguments>::cmArgumentParser(&HandleArchiveExtractCommand::parser,pcVar4);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_98);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleArchiveExtractCommand::parser
                 ,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&parsedArgs.Touch);
  cVar10 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local);
  argIt._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cVar10.Begin._M_current;
  local_1c8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&argIt,1);
  cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Arguments *)local_1b8,
             (cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&HandleArchiveExtractCommand::parser,&local_1c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parsedArgs.Touch,0);
  local_1e0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parsedArgs.Touch);
  local_1e8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parsedArgs.Touch);
  bVar2 = __gnu_cxx::operator!=(&local_1e0,&local_1e8);
  pcVar1 = local_20;
  if (bVar2) {
    b = __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_1e0);
    cmStrCat<char_const(&)[25],std::__cxx11::string&,char_const(&)[2]>
              (&local_208,(char (*) [25])0x100b758,b,(char (*) [2])0x1031a6f);
    cmExecutionStatus::SetError(pcVar1,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = 0;
    inFile.field_2._12_4_ = 1;
    goto LAB_0045c2e4;
  }
  pcVar6 = cmExecutionStatus::GetMakefile(local_20);
  bVar2 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_1b8,pcVar6);
  if (bVar2) {
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = 1;
    inFile.field_2._12_4_ = 1;
    goto LAB_0045c2e4;
  }
  std::__cxx11::string::string
            ((string *)local_230,
             (string *)
             &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
              _M_node_count);
  if ((parsedArgs.Input.field_2._M_local_buf[9] & 1U) == 0) {
    pcVar6 = cmExecutionStatus::GetMakefile(local_20);
    psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar6);
    std::__cxx11::string::string((string *)local_270,(string *)psVar7);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      bVar2 = cmsys::SystemTools::FileIsFullPath((string *)&parsedArgs.Verbose);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_270,(string *)&parsedArgs.Verbose);
      }
      else {
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&local_290,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                   (char (*) [2])0x10b3d11,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &parsedArgs.Verbose);
        std::__cxx11::string::operator=((string *)local_270,(string *)&local_290);
        std::__cxx11::string::~string((string *)&local_290);
      }
      local_298 = cmsys::SystemTools::MakeDirectory((string *)local_270,(mode_t *)0x0);
      bVar2 = cmsys::Status::operator_cast_to_bool(&local_298);
      pcVar1 = local_20;
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_230);
        if (!bVar2) {
          cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
          cmStrCat<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                    (&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &workdir.ResultCode,(char (*) [2])0x10b3d11,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230)
          ;
          std::__cxx11::string::operator=((string *)local_230,(string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&workdir.ResultCode);
        }
        goto LAB_0045c0e6;
      }
      cmStrCat<char_const(&)[29],std::__cxx11::string&>
                (&local_2b8,(char (*) [29])"failed to create directory: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270);
      cmExecutionStatus::SetError(pcVar1,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      cmSystemTools::SetFatalErrorOccurred();
      args_local._7_1_ = 0;
      inFile.field_2._12_4_ = 1;
    }
    else {
LAB_0045c0e6:
      cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_320,(string *)local_270);
      bVar2 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_320);
      pcVar1 = local_20;
      if (bVar2) {
        cmStrCat<char_const(&)[40],std::__cxx11::string&>
                  (&local_340,(char (*) [40])"failed to change working directory to: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270);
        cmExecutionStatus::SetError(pcVar1,&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        cmSystemTools::SetFatalErrorOccurred();
        args_local._7_1_ = 0;
        inFile.field_2._12_4_ = 1;
      }
      else {
        bVar2 = cmSystemTools::ExtractTar
                          ((string *)local_230,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&parsedArgs.Destination.field_2 + 8),
                           (byte)parsedArgs.Patterns.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage & No,
                           (bool)(parsedArgs.Input.field_2._M_local_buf[8] & 1));
        pcVar1 = local_20;
        if (bVar2) {
          inFile.field_2._12_4_ = 0;
        }
        else {
          cmStrCat<char_const(&)[20],std::__cxx11::string&>
                    (&local_360,(char (*) [20])"failed to extract: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230)
          ;
          cmExecutionStatus::SetError(pcVar1,&local_360);
          std::__cxx11::string::~string((string *)&local_360);
          cmSystemTools::SetFatalErrorOccurred();
          args_local._7_1_ = 0;
          inFile.field_2._12_4_ = 1;
        }
      }
      cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_320);
    }
    std::__cxx11::string::~string((string *)local_270);
    if (inFile.field_2._12_4_ == 0) goto LAB_0045c2ba;
  }
  else {
    bVar2 = cmSystemTools::ListTar
                      ((string *)local_230,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&parsedArgs.Destination.field_2 + 8),
                       (bool)(parsedArgs.Input.field_2._M_local_buf[8] & 1));
    pcVar1 = local_20;
    if (bVar2) {
LAB_0045c2ba:
      args_local._7_1_ = 1;
      inFile.field_2._12_4_ = 1;
    }
    else {
      cmStrCat<char_const(&)[17],std::__cxx11::string&>
                ((string *)((long)&destDir.field_2 + 8),(char (*) [17])"failed to list: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
      cmExecutionStatus::SetError(pcVar1,(string *)((long)&destDir.field_2 + 8));
      std::__cxx11::string::~string((string *)(destDir.field_2._M_local_buf + 8));
      cmSystemTools::SetFatalErrorOccurred();
      args_local._7_1_ = 0;
      inFile.field_2._12_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_230);
LAB_0045c2e4:
  HandleArchiveExtractCommand::Arguments::~Arguments((Arguments *)local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parsedArgs.Touch);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleArchiveExtractCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string Input;
    bool Verbose = false;
    bool ListOnly = false;
    std::string Destination;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Patterns;
    bool Touch = false;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("INPUT"_s, &Arguments::Input)
                               .Bind("VERBOSE"_s, &Arguments::Verbose)
                               .Bind("LIST_ONLY"_s, &Arguments::ListOnly)
                               .Bind("DESTINATION"_s, &Arguments::Destination)
                               .Bind("PATTERNS"_s, &Arguments::Patterns)
                               .Bind("TOUCH"_s, &Arguments::Touch);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  std::string inFile = parsedArgs.Input;

  if (parsedArgs.ListOnly) {
    if (!cmSystemTools::ListTar(inFile, parsedArgs.Patterns,
                                parsedArgs.Verbose)) {
      status.SetError(cmStrCat("failed to list: ", inFile));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  } else {
    std::string destDir = status.GetMakefile().GetCurrentBinaryDirectory();
    if (!parsedArgs.Destination.empty()) {
      if (cmSystemTools::FileIsFullPath(parsedArgs.Destination)) {
        destDir = parsedArgs.Destination;
      } else {
        destDir = cmStrCat(destDir, "/", parsedArgs.Destination);
      }

      if (!cmSystemTools::MakeDirectory(destDir)) {
        status.SetError(cmStrCat("failed to create directory: ", destDir));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      if (!cmSystemTools::FileIsFullPath(inFile)) {
        inFile =
          cmStrCat(cmSystemTools::GetCurrentWorkingDirectory(), "/", inFile);
      }
    }

    cmWorkingDirectory workdir(destDir);
    if (workdir.Failed()) {
      status.SetError(
        cmStrCat("failed to change working directory to: ", destDir));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }

    if (!cmSystemTools::ExtractTar(
          inFile, parsedArgs.Patterns,
          parsedArgs.Touch ? cmSystemTools::cmTarExtractTimestamps::No
                           : cmSystemTools::cmTarExtractTimestamps::Yes,
          parsedArgs.Verbose)) {
      status.SetError(cmStrCat("failed to extract: ", inFile));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  return true;
}